

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O3

IO __thiscall adios2::ADIOS::AtIO(ADIOS *this,string *name)

{
  element_type *peVar1;
  pointer pcVar2;
  long *plVar3;
  IO *io;
  size_type *psVar4;
  IO local_80;
  string local_78;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"for io name ",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_78.field_2._M_allocated_capacity = *psVar4;
    local_78.field_2._8_8_ = plVar3[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar4;
    local_78._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_78._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  CheckPointer(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  peVar1 = (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + name->_M_string_length);
  io = (IO *)adios2::core::ADIOS::AtIO(peVar1,(string *)local_58);
  IO::IO(&local_80,io);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return (IO)local_80.m_IO;
}

Assistant:

IO ADIOS::AtIO(const std::string name)
{
    CheckPointer("for io name " + name + ", in call to ADIOS::AtIO");
    return IO(&m_ADIOS->AtIO(name));
}